

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall tonk::OutgoingQueue::PushAndGetFreshBuffer(OutgoingQueue *this)

{
  WindowHeader *pWVar1;
  Allocator *in_RSI;
  Allocator *in_RDI;
  uint neededBytes;
  Locker locker;
  Locker locker_1;
  Lock *in_stack_ffffffffffffff48;
  Locker *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff64;
  uint8_t *ptr;
  Allocator *this_00;
  uint in_stack_ffffffffffffff8c;
  Allocator *this_01;
  
  this_01 = in_RSI;
  if ((in_RSI->PreferredWindows).PreallocatedData[0] != (WindowHeader *)0x0) {
    if (*(int *)&(in_RSI->PreferredWindows).PreallocatedData[0]->field_0x8 == 0) {
      Result::Success();
      return (Result)(ErrorResult *)in_RDI;
    }
    in_stack_ffffffffffffff8c =
         *(int *)&(in_RSI->PreferredWindows).PreallocatedData[0]->field_0x8 + 0x3f;
    ptr = in_RSI->HugeChunkStart;
    this_00 = in_RDI;
    Locker::Locker(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pktalloc::Allocator::Shrink(this_00,ptr,in_stack_ffffffffffffff64);
    Locker::~Locker((Locker *)0x1df5f1);
    if ((in_RSI->PreferredWindows).PreallocatedData[2] == (WindowHeader *)0x0) {
      (in_RSI->PreferredWindows).PreallocatedData[1] =
           (in_RSI->PreferredWindows).PreallocatedData[0];
    }
    else {
      *(WindowHeader **)(in_RSI->PreferredWindows).PreallocatedData[2] =
           (in_RSI->PreferredWindows).PreallocatedData[0];
    }
    (in_RSI->PreferredWindows).PreallocatedData[2] = (in_RSI->PreferredWindows).PreallocatedData[0];
  }
  Locker::Locker((Locker *)in_RSI->HugeChunkStart,in_stack_ffffffffffffff48);
  pWVar1 = (WindowHeader *)pktalloc::Allocator::Allocate(this_01,in_stack_ffffffffffffff8c);
  Locker::~Locker((Locker *)0x1df6bc);
  (in_RSI->PreferredWindows).PreallocatedData[0] = pWVar1;
  if ((in_RSI->PreferredWindows).PreallocatedData[0] == (WindowHeader *)0x0) {
    Result::OutOfMemory();
  }
  else {
    pWVar1 = (in_RSI->PreferredWindows).PreallocatedData[0];
    *(undefined8 *)pWVar1 = 0;
    *(undefined4 *)&pWVar1->field_0x8 = 0;
    *(undefined4 *)&pWVar1->field_0xc = 0;
    Result::Success();
  }
  return (Result)(ErrorResult *)in_RDI;
}

Assistant:

Result OutgoingQueue::PushAndGetFreshBuffer()
{
    if (OutBuffer)
    {
        // If there was no data written yet:
        if (OutBuffer->NextWriteOffset <= 0) {
            return Result::Success();
        }

        const unsigned neededBytes = OutBuffer->NextWriteOffset + kAllocatedOverheadBytes;

        // Reduce memory usage
        Common->WriteAllocator.Shrink(OutBuffer,
            neededBytes);

        // Link at end of list (After NewestQueued)
        if (NewestQueued) {
            NewestQueued->Next = OutBuffer;
        }
        else {
            OldestQueued = OutBuffer;
        }
        NewestQueued = OutBuffer;
        TONK_DEBUG_ASSERT(OutBuffer->Next == nullptr);

        TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Flushed OutBuffer = ", OutBuffer);
    }

    OutBuffer = (OutgoingQueuedDatagram*)Common->WriteAllocator.Allocate(
        kQueueHeaderBytes + Common->UDPMaxDatagramBytes);

    if (!OutBuffer) {
        return Result::OutOfMemory();
    }

    OutBuffer->Initialize();

    TONK_VERBOSE_OUTGOING_LOG("PushAndGetFreshBuffer : Created new OutBuffer = ", OutBuffer);

    return Result::Success();
}